

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O0

void Env_bcast_string(Env *env,char *data,int len,int root)

{
  Bool_t BVar1;
  int root_local;
  int len_local;
  char *data_local;
  Env *env_local;
  
  BVar1 = Env_mpi_are_values_set_(env);
  if (BVar1 != 0) {
    return;
  }
  __assert_fail("Env_mpi_are_values_set_( env )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                ,0x15c,"void Env_bcast_string(Env *, char *, int, int)");
}

Assistant:

void Env_bcast_string( Env* env, char* data, int len, int root )
{
  Assert( Env_mpi_are_values_set_( env ) );
#ifdef USE_MPI
  const int mpi_code = MPI_Bcast( data, len, MPI_CHAR, root,
                                                Env_mpi_active_comm_( env ) );
  Assert( mpi_code == MPI_SUCCESS );
#endif
}